

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void TestRoundTrip(char *fn)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  Allocator AVar6;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar7
  ;
  Message *pMVar8;
  ulong uVar9;
  Point2i p;
  int y;
  long lVar10;
  int x;
  long lVar11;
  int iVar12;
  size_type *psVar14;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
  ;
  char *pcVar15;
  ColorEncodingHandle *encoding;
  long lVar16;
  undefined1 auVar17 [16];
  Float FVar18;
  undefined1 auVar19 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_register_000012c4 [12];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> values;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  AssertHelper local_4a8;
  AssertHelper local_4a0;
  float delta;
  AssertionResult gtest_ar__1;
  Point2i res;
  AssertionResult gtest_ar_;
  undefined1 local_430 [48];
  string local_400 [32];
  string filename;
  ImageChannelDesc rgbDesc;
  WrapMode2D local_388;
  WrapMode2D local_380;
  ColorEncodingHandle local_378;
  ColorEncodingHandle local_370;
  ImageAndMetadata readImage;
  Image image;
  int iVar13;
  
  res.super_Tuple2<pbrt::Point2,_int>.x = 0x10;
  res.super_Tuple2<pbrt::Point2,_int>.y = 0x1d;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&readImage,"R",(allocator<char> *)&gtest_ar_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)readImage.image.channelNames.field_2.fixed,"G",(allocator<char> *)&rgbDesc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(readImage.image.channelNames.field_2.fixed + 1),"B",
             (allocator<char> *)&filename);
  encoding = &local_370;
  local_370.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  AVar6.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&readImage;
  pbrt::Image::Image(&image,Float,(Point2i)0x1d00000010,channels,encoding,AVar6);
  lVar10 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&readImage.image.format + lVar10));
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x20);
  lVar16 = 0;
  for (lVar10 = 0; lVar10 < res.super_Tuple2<pbrt::Point2,_int>.y; lVar10 = lVar10 + 1) {
    for (lVar11 = 0; lVar11 < res.super_Tuple2<pbrt::Point2,_int>.x; lVar11 = lVar11 + 1) {
      auVar3 = vpinsrd_avx(ZEXT416((uint)res.super_Tuple2<pbrt::Point2,_int>.x),
                           res.super_Tuple2<pbrt::Point2,_int>.y,1);
      auVar19._0_4_ = (float)(int)lVar11;
      auVar19._4_12_ = in_register_000012c4;
      auVar2 = vinsertps_avx(auVar19,ZEXT416((uint)(float)(int)lVar10),0x10);
      auVar17 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      in_ZMM2 = ZEXT1664(auVar17);
      auVar17 = vpaddd_avx(auVar3,auVar17);
      auVar17 = vcvtdq2ps_avx(auVar17);
      auVar17 = vdivps_avx(auVar2,auVar17);
      uVar1 = vmovlps_avx(auVar17);
      readImage.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = -0x40400000;
      readImage.image.format = (int)uVar1;
      readImage.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)uVar1 >> 0x20);
      values.n = 3;
      values.ptr = (float *)&readImage;
      pbrt::Image::SetChannels(&image,(Point2i)(lVar16 + lVar11),values);
    }
    lVar16 = lVar16 + 0x100000000;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&readImage,fn,(allocator<char> *)&gtest_ar_);
  std::__cxx11::string::string((string *)&filename,(string *)&readImage);
  std::__cxx11::string::~string((string *)&readImage);
  readImage.image._0_64_ = ZEXT1664(ZEXT816(0) << 0x40);
  readImage.image.p16.nAlloc = (size_t)&readImage.image.p16;
  readImage.image.p8.ptr = (uchar *)0x0;
  readImage.image.p8.nAlloc = 0;
  readImage.image.p8.nStored = 0;
  readImage.image.p16.alloc.memoryResource = (memory_resource *)0x0;
  readImage.image.p16.ptr = (Half *)0x0;
  readImage.image.channelNames._112_40_ = ZEXT1640(ZEXT816(0) << 0x40);
  readImage.image.channelNames.nStored = 0;
  readImage.image.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0x0;
  readImage.image.p8.alloc.memoryResource = (memory_resource *)0x0;
  readImage.image.p32.alloc.memoryResource = (memory_resource *)0x0;
  readImage.image.channelNames.field_2._32_64_ = (undefined1  [64])readImage.image._0_64_;
  readImage.image.p16.nStored = readImage.image.p16.nAlloc;
  gtest_ar_.success_ = pbrt::Image::Write(&image,&filename,(ImageMetadata *)&readImage);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)&readImage);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&rgbDesc);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&readImage,(internal *)&gtest_ar_,
               (AssertionResult *)"image.Write(filename)","false","true",(char *)encoding);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x279,(char *)readImage.image._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgbDesc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&readImage);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&rgbDesc);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    AVar6.memoryResource = pstd::pmr::new_delete_resource();
    local_378.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::Read(&readImage,&filename,AVar6,&local_378);
    rgbDesc.offset.alloc.memoryResource =
         (memory_resource *)readImage.image.resolution.super_Tuple2<pbrt::Point2,_int>;
    testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
              ((internal *)&gtest_ar_,"readImage.image.Resolution()","res",(Point2<int> *)&rgbDesc,
               &res);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&rgbDesc);
      if (gtest_ar_.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x27c,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&rgbDesc);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&rgbDesc);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar_,"R",(allocator<char> *)&gtest_ar__1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_430 + 0x10),"G",(allocator<char> *)&local_4a8);
      std::__cxx11::string::string<std::allocator<char>>
                (local_400,"B",(allocator<char> *)&local_4a0);
      requestedChannels.n = 3;
      requestedChannels.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_;
      pbrt::Image::GetChannelDesc(&rgbDesc,&readImage.image,requestedChannels);
      lVar10 = 0x40;
      do {
        std::__cxx11::string::~string((string *)(local_430 + lVar10 + -0x10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      this = &gtest_ar__1.message_;
      gtest_ar__1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar__1.success_ = rgbDesc.offset.nStored != 0;
      if (rgbDesc.offset.nStored == 0) {
        testing::Message::Message((Message *)&local_4a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"(bool)rgbDesc",
                   "false","true",(char *)encoding);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x27f,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
        testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
        testing::internal::AssertHelper::~AssertHelper(&local_4a0);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_4a8);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(this);
        for (lVar10 = 0; lVar10 < res.super_Tuple2<pbrt::Point2,_int>.y; lVar10 = lVar10 + 1) {
          for (uVar9 = 0; (long)uVar9 < (long)res.super_Tuple2<pbrt::Point2,_int>.x;
              uVar9 = uVar9 + 1) {
            pbrt::WrapMode2D::WrapMode2D(&local_380,Clamp);
            p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar10 << 0x20 | uVar9);
            pbrt::Image::GetChannels
                      ((ImageChannelValues *)&gtest_ar_,&readImage.image,p,&rgbDesc,local_380);
            lVar16 = 0;
            for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
              pbrt::WrapMode2D::WrapMode2D(&local_388,Clamp);
              iVar5 = (int)lVar16;
              FVar18 = pbrt::Image::GetChannel(&image,p,iVar5,local_388);
              sVar7 = gtest_ar_.message_;
              if (gtest_ar_.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                sVar7.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_430;
              }
              delta = FVar18 - *(float *)((long)&((sVar7.ptr_)->_M_dataplus)._M_p + lVar11);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&gtest_ar__1,"pfm",(allocator<char> *)&local_4a8);
              bVar4 = pbrt::HasExtension(&filename,(string *)&gtest_ar__1);
              std::__cxx11::string::~string((string *)&gtest_ar__1);
              iVar12 = (int)uVar9;
              iVar13 = (int)lVar10;
              if (bVar4) {
                local_4a8.data_ = local_4a8.data_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<int,float>
                          ((internal *)&gtest_ar__1,"0","delta",(int *)&local_4a8,&delta);
                if (gtest_ar__1.success_ == false) {
                  testing::Message::Message((Message *)&local_4a8);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,(string *)&filename);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,":(");
                  std::ostream::operator<<(&(local_4a8.data_)->line,iVar12);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,", ");
                  std::ostream::operator<<(&(local_4a8.data_)->line,iVar13);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,") c = ");
                  std::ostream::operator<<(&(local_4a8.data_)->line,iVar5);
                  std::operator<<((ostream *)&(local_4a8.data_)->line," wrote ");
                  std::ostream::operator<<(&(local_4a8.data_)->line,FVar18);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,", read ");
                  sVar7 = gtest_ar_.message_;
                  if (gtest_ar_.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    sVar7.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_430;
                  }
                  pMVar8 = testing::Message::operator<<
                                     ((Message *)&local_4a8,
                                      (float *)((long)&((sVar7.ptr_)->_M_dataplus)._M_p + lVar11));
                  pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [11])", delta = ");
                  pMVar8 = testing::Message::operator<<(pMVar8,&delta);
                  pcVar15 = "";
                  if (gtest_ar__1.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar15 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_4a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                             ,0x28a,pcVar15);
                  testing::internal::AssertHelper::operator=(&local_4a0,pMVar8);
                  goto LAB_0034c7bc;
                }
                goto LAB_0034c7cc;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&gtest_ar__1,"exr",(allocator<char> *)&local_4a8);
              bVar4 = pbrt::HasExtension(&filename,(string *)&gtest_ar__1);
              std::__cxx11::string::~string((string *)&gtest_ar__1);
              if (bVar4) {
                if (lVar16 == 2) {
                  local_4a8.data_ = (AssertHelperData *)((ulong)local_4a8.data_._4_4_ << 0x20);
                  testing::internal::CmpHelperEQ<int,float>
                            ((internal *)&gtest_ar__1,"0","delta",(int *)&local_4a8,&delta);
                  if (gtest_ar__1.success_ == false) {
                    testing::Message::Message((Message *)&local_4a8);
                    std::operator<<((ostream *)&(local_4a8.data_)->line,"(");
                    std::ostream::operator<<(&(local_4a8.data_)->line,iVar12);
                    std::operator<<((ostream *)&(local_4a8.data_)->line,", ");
                    std::ostream::operator<<(&(local_4a8.data_)->line,iVar13);
                    std::operator<<((ostream *)&(local_4a8.data_)->line,") c = ");
                    std::ostream::operator<<(&(local_4a8.data_)->line,2);
                    std::operator<<((ostream *)&(local_4a8.data_)->line," wrote ");
                    std::ostream::operator<<(&(local_4a8.data_)->line,FVar18);
                    std::operator<<((ostream *)&(local_4a8.data_)->line,", read ");
                    psVar14 = &(gtest_ar_.message_.ptr_)->_M_string_length;
                    if (gtest_ar_.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      psVar14 = (size_type *)(local_430 + 8);
                    }
                    pMVar8 = testing::Message::operator<<((Message *)&local_4a8,(float *)psVar14);
                    pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [11])", delta = ");
                    pMVar8 = testing::Message::operator<<(pMVar8,&delta);
                    pcVar15 = "";
                    if (gtest_ar__1.message_.ptr_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar15 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_4a0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                               ,0x290,pcVar15);
                    testing::internal::AssertHelper::operator=(&local_4a0,pMVar8);
LAB_0034c7bc:
                    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_4a8);
                  }
                }
                else {
                  auVar2._8_4_ = 0x7fffffff;
                  auVar2._0_8_ = 0x7fffffff7fffffff;
                  auVar2._12_4_ = 0x7fffffff;
                  auVar17 = vandps_avx512vl(ZEXT416((uint)delta),auVar2);
                  local_4a8.data_ = (AssertHelperData *)0x3f50624dd2f1a9fc;
                  local_4a0.data_._0_4_ = auVar17._0_4_;
                  testing::internal::CmpHelperLT<float,double>
                            ((internal *)&gtest_ar__1,"std::abs(delta)",".001",(float *)&local_4a0,
                             (double *)&local_4a8);
                  if (gtest_ar__1.success_ == false) {
                    testing::Message::Message((Message *)&local_4a8);
                    std::operator<<((ostream *)&(local_4a8.data_)->line,(string *)&filename);
                    std::operator<<((ostream *)&(local_4a8.data_)->line,":(");
                    std::ostream::operator<<(&(local_4a8.data_)->line,iVar12);
                    std::operator<<((ostream *)&(local_4a8.data_)->line,", ");
                    std::ostream::operator<<(&(local_4a8.data_)->line,iVar13);
                    std::operator<<((ostream *)&(local_4a8.data_)->line,") c = ");
                    std::ostream::operator<<(&(local_4a8.data_)->line,iVar5);
                    std::operator<<((ostream *)&(local_4a8.data_)->line," wrote ");
                    std::ostream::operator<<(&(local_4a8.data_)->line,FVar18);
                    std::operator<<((ostream *)&(local_4a8.data_)->line,", read ");
                    sVar7 = gtest_ar_.message_;
                    if (gtest_ar_.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      sVar7.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_430;
                    }
                    pMVar8 = testing::Message::operator<<
                                       ((Message *)&local_4a8,
                                        (float *)((long)&((sVar7.ptr_)->_M_dataplus)._M_p + lVar11))
                    ;
                    pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [11])", delta = ");
                    pMVar8 = testing::Message::operator<<(pMVar8,&delta);
                    pcVar15 = "";
                    if (gtest_ar__1.message_.ptr_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar15 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_4a0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                               ,0x294,pcVar15);
                    testing::internal::AssertHelper::operator=(&local_4a0,pMVar8);
                    goto LAB_0034c7bc;
                  }
                }
              }
              else if (lVar16 == 2) {
                local_4a8.data_ = (AssertHelperData *)((ulong)local_4a8.data_._4_4_ << 0x20);
                psVar14 = &(gtest_ar_.message_.ptr_)->_M_string_length;
                if (gtest_ar_.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  psVar14 = (size_type *)(local_430 + 8);
                }
                testing::internal::CmpHelperEQ<int,float>
                          ((internal *)&gtest_ar__1,"0","rgb[c]",(int *)&local_4a8,(float *)psVar14)
                ;
                if (gtest_ar__1.success_ == false) {
                  testing::Message::Message((Message *)&local_4a8);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,"(");
                  std::ostream::operator<<(&(local_4a8.data_)->line,iVar12);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,", ");
                  std::ostream::operator<<(&(local_4a8.data_)->line,iVar13);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,") c = ");
                  std::ostream::operator<<(&(local_4a8.data_)->line,2);
                  std::operator<<((ostream *)&(local_4a8.data_)->line," wrote ");
                  std::ostream::operator<<(&(local_4a8.data_)->line,FVar18);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,", read ");
                  psVar14 = &(gtest_ar_.message_.ptr_)->_M_string_length;
                  if (gtest_ar_.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    psVar14 = (size_type *)(local_430 + 8);
                  }
                  pMVar8 = testing::Message::operator<<((Message *)&local_4a8,(float *)psVar14);
                  pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [19])" (expected 0 back)");
                  pcVar15 = "";
                  if (gtest_ar__1.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar15 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_4a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                             ,0x29c,pcVar15);
                  testing::internal::AssertHelper::operator=(&local_4a0,pMVar8);
                  goto LAB_0034c7bc;
                }
              }
              else {
                auVar17._8_4_ = 0x7fffffff;
                auVar17._0_8_ = 0x7fffffff7fffffff;
                auVar17._12_4_ = 0x7fffffff;
                auVar17 = vandps_avx512vl(ZEXT416((uint)delta),auVar17);
                local_4a8.data_ = (AssertHelperData *)0x3f947ae147ae147b;
                local_4a0.data_._0_4_ = auVar17._0_4_;
                testing::internal::CmpHelperLT<float,double>
                          ((internal *)&gtest_ar__1,"std::abs(delta)",".02",(float *)&local_4a0,
                           (double *)&local_4a8);
                if (gtest_ar__1.success_ == false) {
                  testing::Message::Message((Message *)&local_4a8);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,(string *)&filename);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,":(");
                  std::ostream::operator<<(&(local_4a8.data_)->line,iVar12);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,", ");
                  std::ostream::operator<<(&(local_4a8.data_)->line,iVar13);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,") c = ");
                  std::ostream::operator<<(&(local_4a8.data_)->line,iVar5);
                  std::operator<<((ostream *)&(local_4a8.data_)->line," wrote ");
                  std::ostream::operator<<(&(local_4a8.data_)->line,FVar18);
                  std::operator<<((ostream *)&(local_4a8.data_)->line,", read ");
                  sVar7 = gtest_ar_.message_;
                  if (gtest_ar_.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    sVar7.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_430;
                  }
                  pMVar8 = testing::Message::operator<<
                                     ((Message *)&local_4a8,
                                      (float *)((long)&((sVar7.ptr_)->_M_dataplus)._M_p + lVar11));
                  pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [11])", delta = ");
                  pMVar8 = testing::Message::operator<<(pMVar8,&delta);
                  pcVar15 = "";
                  if (gtest_ar__1.message_.ptr_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar15 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_4a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                             ,0x2a2,pcVar15);
                  testing::internal::AssertHelper::operator=(&local_4a0,pMVar8);
                  goto LAB_0034c7bc;
                }
              }
LAB_0034c7cc:
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__1.message_);
              lVar16 = lVar16 + 1;
            }
            pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                       &gtest_ar_);
          }
        }
        gtest_ar__1.success_ = false;
        gtest_ar__1._1_3_ = 0;
        iVar5 = remove(filename._M_dataplus._M_p);
        local_4a8.data_._0_4_ = iVar5;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"0","remove(filename.c_str())",(int *)&gtest_ar__1,
                   (int *)&local_4a8);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_4a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x2ab,pcVar15);
          testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper(&local_4a8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__1);
        }
        this = &gtest_ar_.message_;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(this);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&rgbDesc.offset);
    }
    pbrt::ImageAndMetadata::~ImageAndMetadata(&readImage);
  }
  std::__cxx11::string::~string((string *)&filename);
  pbrt::Image::~Image(&image);
  return;
}

Assistant:

static void TestRoundTrip(const char *fn) {
    Point2i res(16, 29);
    Image image(PixelFormat::Float, res, {"R", "G", "B"});
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            image.SetChannels({x, y}, {Float(x) / Float(res[0] - 1),
                                       Float(y) / Float(res[1] - 1), Float(-1.5)});

    std::string filename = inTestDir(fn);
    ASSERT_TRUE(image.Write(filename));

    ImageAndMetadata readImage = Image::Read(filename);
    ASSERT_EQ(readImage.image.Resolution(), res);

    ImageChannelDesc rgbDesc = readImage.image.GetChannelDesc({"R", "G", "B"});
    ASSERT_TRUE((bool)rgbDesc);

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x) {
            ImageChannelValues rgb = readImage.image.GetChannels({x, y}, rgbDesc);

            for (int c = 0; c < 3; ++c) {
                float wrote = image.GetChannel({x, y}, c);
                float delta = wrote - rgb[c];
                if (HasExtension(filename, "pfm")) {
                    // Everything should come out exact.
                    EXPECT_EQ(0, delta) << filename << ":(" << x << ", " << y
                                        << ") c = " << c << " wrote " << wrote
                                        << ", read " << rgb[c] << ", delta = " << delta;
                } else if (HasExtension(filename, "exr")) {
                    if (c == 2)
                        // -1.5 is exactly representable as a float.
                        EXPECT_EQ(0, delta)
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << ", delta = " << delta;
                    else
                        EXPECT_LT(std::abs(delta), .001)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                } else {
                    // 8 bit format...
                    if (c == 2)
                        // -1.5 should be clamped to zero.
                        EXPECT_EQ(0, rgb[c])
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << " (expected 0 back)";
                    else
                        // Allow a fair amount of slop, since there's an sRGB
                        // conversion before quantization to 8-bits...
                        EXPECT_LT(std::abs(delta), .02)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                }
            }
        }

    // Clean up
    EXPECT_EQ(0, remove(filename.c_str()));
}